

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int ConnectRPLIDARx(RPLIDAR *pRPLIDAR,char *szCfgFilePath)

{
  deque<double,_std::allocator<double>_> local_c8;
  deque<double,_std::allocator<double>_> local_78;
  int local_28;
  int local_24;
  int res;
  int id;
  char *szCfgFilePath_local;
  RPLIDAR *pRPLIDAR_local;
  
  local_24 = 0;
  local_28 = 1;
  do {
    if (addrsRPLIDAR[local_24] == (void *)0x0) {
      _res = szCfgFilePath;
      szCfgFilePath_local = (char *)pRPLIDAR;
      local_28 = ConnectRPLIDAR(pRPLIDAR,szCfgFilePath);
      if (local_28 != 0) {
        return local_28;
      }
      memset(&local_78,0,0x50);
      std::deque<double,_std::allocator<double>_>::deque(&local_78);
      std::deque<double,_std::allocator<double>_>::operator=
                (anglesvectorRPLIDAR + local_24,&local_78);
      std::deque<double,_std::allocator<double>_>::~deque(&local_78);
      memset(&local_c8,0,0x50);
      std::deque<double,_std::allocator<double>_>::deque(&local_c8);
      std::deque<double,_std::allocator<double>_>::operator=
                (distancesvectorRPLIDAR + local_24,&local_c8);
      std::deque<double,_std::allocator<double>_>::~deque(&local_c8);
      addrsRPLIDAR[local_24] = szCfgFilePath_local;
      return 0;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectRPLIDARx(RPLIDAR* pRPLIDAR, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectRPLIDAR(pRPLIDAR, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

#ifdef __cplusplus
	anglesvectorRPLIDAR[id] = std::deque<double>();
	distancesvectorRPLIDAR[id] = std::deque<double>();
#endif // __cplusplus

	addrsRPLIDAR[id] = pRPLIDAR;

	return EXIT_SUCCESS;
}